

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3Getint(char **pz)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  
  pbVar3 = (byte *)*pz;
  iVar2 = 0;
  while( true ) {
    bVar1 = *pbVar3;
    if (9 < (byte)(bVar1 - 0x30)) break;
    pbVar3 = pbVar3 + 1;
    iVar2 = iVar2 * 10 + (uint)bVar1 + -0x30;
  }
  *pz = (char *)pbVar3;
  return iVar2;
}

Assistant:

static int fts3Getint(const char **pz){
  const char *z = *pz;
  int i = 0;
  while( (*z)>='0' && (*z)<='9' ) i = 10*i + *(z++) - '0';
  *pz = z;
  return i;
}